

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::tag_scalar_t(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
               *this,tag_t<cfgfile::string_trait_t> *owner,string_t *name,bool is_mandatory)

{
  undefined8 *in_RDI;
  string_t *unaff_retaddr;
  undefined7 in_stack_00000008;
  
  tag_t<cfgfile::string_trait_t>::tag_t
            ((tag_t<cfgfile::string_trait_t> *)name,
             (tag_t<cfgfile::string_trait_t> *)CONCAT17(is_mandatory,in_stack_00000008),
             unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__tag_scalar_t_00119ce8;
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  in_RDI[0x10] = 0;
  return;
}

Assistant:

tag_scalar_t( tag_t< Trait > & owner, const typename Trait::string_t & name,
		bool is_mandatory = false )
		:	tag_t< Trait >( owner, name, is_mandatory )
		,	m_value( typename Trait::string_t() )
		,	m_constraint( nullptr )
	{
	}